

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O1

unique_ptr<cpptrace::detail::libdwarf::symbol_resolver,_std::default_delete<cpptrace::detail::libdwarf::symbol_resolver>_>
 __thiscall cpptrace::detail::libdwarf::make_dwarf_resolver(libdwarf *this,string *object_path)

{
  dwarf_resolver *this_00;
  optional<cpptrace::detail::libdwarf::skeleton_info,_0> local_40;
  
  this_00 = (dwarf_resolver *)operator_new(0x170);
  local_40.holds_value = false;
  dwarf_resolver::dwarf_resolver(this_00,object_path,&local_40);
  *(dwarf_resolver **)this = this_00;
  if (local_40.holds_value == true) {
    die_object::~die_object((die_object *)&local_40);
  }
  return (__uniq_ptr_data<cpptrace::detail::libdwarf::symbol_resolver,_std::default_delete<cpptrace::detail::libdwarf::symbol_resolver>,_true,_true>
          )(__uniq_ptr_data<cpptrace::detail::libdwarf::symbol_resolver,_std::default_delete<cpptrace::detail::libdwarf::symbol_resolver>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<symbol_resolver> make_dwarf_resolver(const std::string& object_path) {
        return std::unique_ptr<dwarf_resolver>(new dwarf_resolver(object_path));
    }